

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

NamespaceAliasDeclaration * __thiscall
soul::ResolutionPass::NamespaceAliasResolver::visit
          (NamespaceAliasResolver *this,NamespaceAliasDeclaration *instance)

{
  bool bVar1;
  Expression *pEVar2;
  Namespace *pNVar3;
  Context *this_00;
  CompileMessage local_150;
  int local_114;
  pool_ptr<soul::AST::Namespace> local_110;
  IdentifierPath local_108;
  CompileMessage local_b0;
  pool_ptr<soul::AST::Namespace> local_78;
  pool_ptr<soul::AST::Namespace> target;
  pool_ptr<soul::AST::Expression> local_60;
  undefined1 local_58 [8];
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> specialisationArgs;
  NamespaceAliasDeclaration *instance_local;
  NamespaceAliasResolver *this_local;
  
  specialisationArgs.space[3] = (uint64_t)instance;
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,instance);
  bVar1 = AST::NamespaceAliasDeclaration::isResolved
                    ((NamespaceAliasDeclaration *)specialisationArgs.space[3]);
  if (bVar1) {
    return (NamespaceAliasDeclaration *)specialisationArgs.space[3];
  }
  bVar1 = pool_ptr<soul::AST::Expression>::operator==
                    ((pool_ptr<soul::AST::Expression> *)(specialisationArgs.space[3] + 0x30),
                     (void *)0x0);
  if (bVar1) {
    return (NamespaceAliasDeclaration *)specialisationArgs.space[3];
  }
  local_60.object = *(Expression **)(specialisationArgs.space[3] + 0x38);
  AST::CommaSeparatedList::getAsExpressionList
            ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)local_58,
             &local_60);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_60);
  pEVar2 = pool_ptr<soul::AST::Expression>::operator->
                     ((pool_ptr<soul::AST::Expression> *)(specialisationArgs.space[3] + 0x30));
  (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[7])(&local_78);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_78);
  if (bVar1) {
    pNVar3 = pool_ptr<soul::AST::Namespace>::operator->(&local_78);
    bVar1 = ModuleInstanceResolver::validateSpecialisationArgs
                      (&this->super_ModuleInstanceResolver,(ArgList *)local_58,
                       &(pNVar3->super_ModuleBase).specialisationParams,false);
    if (!bVar1) {
      this_00 = (Context *)(specialisationArgs.space[3] + 0x10);
      pNVar3 = pool_ptr<soul::AST::Namespace>::operator->(&local_78);
      (*(pNVar3->super_ModuleBase).super_ASTObject._vptr_ASTObject[0xe])(&local_108);
      Errors::wrongNumArgsForNamespace<soul::IdentifierPath>(&local_b0,&local_108);
      AST::Context::throwError(this_00,&local_b0,false);
    }
    pNVar3 = pool_ptr<soul::AST::Namespace>::operator->(&local_78);
    bVar1 = ModuleInstanceResolver::canResolveAllSpecialisationArgs
                      (&this->super_ModuleInstanceResolver,(ArgList *)local_58,
                       &(pNVar3->super_ModuleBase).specialisationParams);
    if (bVar1) {
      pNVar3 = pool_ptr<soul::AST::Namespace>::operator*(&local_78);
      pNVar3 = ModuleInstanceResolver::getOrAddNamespaceSpecialisation
                         (&this->super_ModuleInstanceResolver,pNVar3,(ArgList *)local_58);
      pool_ptr<soul::AST::Namespace>::pool_ptr<soul::AST::Namespace,void>(&local_110,pNVar3);
      *(Namespace **)(specialisationArgs.space[3] + 0x40) = local_110.object;
      pool_ptr<soul::AST::Namespace>::~pool_ptr(&local_110);
      (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
      super_RewritingASTVisitor.itemsReplaced =
           (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
           super_RewritingASTVisitor.itemsReplaced + 1;
      this_local = (NamespaceAliasResolver *)specialisationArgs.space[3];
      local_114 = 1;
      goto LAB_004499c9;
    }
  }
  else if (((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors
           & 1U) == 0) {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->
                       ((pool_ptr<soul::AST::Expression> *)(specialisationArgs.space[3] + 0x30));
    Errors::expectedNamespaceName<>();
    AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_150,false);
  }
  local_114 = 0;
LAB_004499c9:
  pool_ptr<soul::AST::Namespace>::~pool_ptr(&local_78);
  if (local_114 == 0) {
    (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails =
         (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails + 1;
    this_local = (NamespaceAliasResolver *)specialisationArgs.space[3];
    local_114 = 1;
  }
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::~ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)local_58);
  return (NamespaceAliasDeclaration *)this_local;
}

Assistant:

AST::NamespaceAliasDeclaration& visit (AST::NamespaceAliasDeclaration& instance) override
        {
            super::visit (instance);

            if (instance.isResolved())
                return instance;

            if (instance.targetNamespace == nullptr)
                return instance;

            auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (instance.specialisationArgs);

            if (auto target = instance.targetNamespace->getAsNamespace())
            {
                if (! validateSpecialisationArgs (specialisationArgs, target->specialisationParams, false))
                    instance.context.throwError (Errors::wrongNumArgsForNamespace (target->getFullyQualifiedDisplayPath()));

                if (canResolveAllSpecialisationArgs (specialisationArgs, target->specialisationParams))
                {
                    instance.resolvedNamespace = getOrAddNamespaceSpecialisation (*target, specialisationArgs);
                    ++itemsReplaced;
                    return instance;
                }
            }
            else
            {
                if (! ignoreErrors)
                    instance.targetNamespace->context.throwError (Errors::expectedNamespaceName());
            }

            ++numFails;
            return instance;
        }